

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O0

bool __thiscall
slang::parsing::Preprocessor::expandReplacementList
          (Preprocessor *this,span<const_slang::parsing::Token,_18446744073709551615UL> *tokens,
          SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
          *alreadyExpanded)

{
  string_view arg;
  Token prevToken;
  const_iterator pos_;
  span<const_slang::parsing::Token,_18446744073709551615UL> newBuffer;
  DefineDirectiveSyntax **ppDVar1;
  bool bVar2;
  SyntaxKind SVar3;
  uint n_;
  int iVar4;
  equal_to<const_slang::syntax::DefineDirectiveSyntax_*> *peVar5;
  DefineDirectiveSyntax **ppDVar6;
  Info *pIVar7;
  size_t sVar8;
  group_type *pgVar9;
  value_type *ppDVar10;
  undefined4 extraout_var;
  span<const_slang::parsing::Token,_18446744073709551615UL> *in_RDX;
  EVP_PKEY_CTX *src;
  Preprocessor *in_RSI;
  undefined8 *in_RDI;
  Token TVar11;
  MacroDef MVar12;
  iterator iVar13;
  span<const_slang::parsing::Token,_18446744073709551615UL> expanded;
  MacroExpansion expansion;
  MacroActualArgumentListSyntax *actualArgs;
  MacroDef macro;
  Token token;
  MacroParser parser;
  bool expandedSomething;
  SmallVector<slang::parsing::Token,_16UL> expansionBuffer;
  SmallVector<slang::parsing::Token,_16UL> outBuffer;
  const_iterator pos;
  locator loc;
  size_t pos0;
  size_t hash_1;
  DefineDirectiveSyntax **k;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_2;
  prober pb_1;
  size_t hash;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos_1;
  prober pb;
  iterator it;
  size_t hash_2;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_3;
  prober pb_2;
  undefined4 in_stack_fffffffffffff6b8;
  undefined4 in_stack_fffffffffffff6bc;
  Preprocessor *in_stack_fffffffffffff6c0;
  SourceLocation in_stack_fffffffffffff6c8;
  SmallVectorBase<slang::parsing::Token> *in_stack_fffffffffffff6d0;
  Preprocessor *in_stack_fffffffffffff6d8;
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
  *in_stack_fffffffffffff6e0;
  Diagnostic *in_stack_fffffffffffff700;
  DefineDirectiveSyntax **in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff710;
  uint in_stack_fffffffffffff714;
  Diagnostic *in_stack_fffffffffffff720;
  size_t in_stack_fffffffffffff728;
  Preprocessor *in_stack_fffffffffffff730;
  Preprocessor *pPVar14;
  __extent_storage<18446744073709551615UL> *in_stack_fffffffffffff738;
  __extent_storage<18446744073709551615UL> *p_Var15;
  Info *in_stack_fffffffffffff740;
  MacroParser *in_stack_fffffffffffff838;
  DefineDirectiveSyntax **in_stack_fffffffffffff840;
  Info *in_stack_fffffffffffff848;
  SourceManager *local_750;
  size_t local_748;
  pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
  local_730;
  undefined8 local_718;
  undefined8 uStack_710;
  Token local_708;
  MacroExpansion local_6f8;
  Token local_6c8;
  MacroActualArgumentListSyntax *local_6b8;
  undefined4 local_6ac;
  string_view local_6a8;
  SourceLocation local_698;
  undefined4 local_68c;
  undefined6 local_688;
  undefined2 uStack_682;
  MacroIntrinsic local_680;
  bool bStack_67c;
  bool bStack_67b;
  undefined2 uStack_67a;
  Token local_678;
  undefined1 local_668 [24];
  Info *pIStack_650;
  Token local_648;
  SourceManager *local_638;
  pointer pDStack_630;
  MacroParser local_618;
  byte local_5f1;
  SmallVectorBase<slang::parsing::Token> local_5f0 [7];
  SmallVectorBase<slang::parsing::Token> local_4d8 [6];
  SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
  *in_stack_fffffffffffffc38;
  span<const_slang::parsing::Token,_18446744073709551615UL> *psVar16;
  bool local_3a1;
  bool local_339 [25];
  iterator local_320;
  bool local_309 [25];
  iterator local_2f0;
  bool local_2d9;
  iterator local_2d8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
  local_2c8;
  size_t local_2b0;
  size_t local_2a8;
  DefineDirectiveSyntax **local_2a0;
  undefined1 *local_298;
  __extent_storage<18446744073709551615UL> *local_290;
  uint local_284;
  value_type *local_280;
  value_type *local_278;
  uint local_26c;
  group_type *local_268;
  size_t local_260;
  pow2_quadratic_prober local_258;
  size_t local_248;
  size_t local_240;
  DefineDirectiveSyntax **local_238;
  __extent_storage<18446744073709551615UL> *local_230;
  DefineDirectiveSyntax **local_228;
  __extent_storage<18446744073709551615UL> *local_220;
  char_pointer local_218;
  table_element_pointer local_210;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
  local_208;
  DefineDirectiveSyntax **local_1f0;
  __extent_storage<18446744073709551615UL> *local_1e8;
  iterator local_1e0;
  size_t local_1d0;
  DefineDirectiveSyntax **local_1c8;
  __extent_storage<18446744073709551615UL> *local_1c0;
  uint local_1b4;
  value_type *local_1b0;
  value_type *local_1a8;
  uint local_19c;
  group_type *local_198;
  size_t local_190;
  pow2_quadratic_prober local_188;
  size_t local_178;
  Info *local_170;
  DefineDirectiveSyntax **local_168;
  __extent_storage<18446744073709551615UL> *local_160;
  table_erase_return_type<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>_>
  local_158;
  pointer local_148;
  table_element_pointer ppDStack_140;
  iterator local_130;
  pointer local_120;
  table_element_pointer ppDStack_118;
  Diagnostic *in_stack_fffffffffffffef0;
  MacroExpansion *in_stack_fffffffffffffef8;
  Preprocessor *in_stack_ffffffffffffff00;
  MacroDef in_stack_ffffffffffffff08;
  pointer local_d0;
  table_element_pointer local_c8;
  uint local_8c;
  pow2_quadratic_prober local_78;
  Info *local_68;
  size_t local_60;
  Diagnostic *local_58;
  __extent_storage<18446744073709551615UL> *local_50;
  pointer local_48;
  table_element_pointer ppDStack_40;
  Preprocessor *local_38;
  undefined1 local_30 [32];
  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
  *local_10;
  Preprocessor *local_8;
  
  SmallVector<slang::parsing::Token,_16UL>::SmallVector
            ((SmallVector<slang::parsing::Token,_16UL> *)0x63572c);
  SmallVector<slang::parsing::Token,_16UL>::SmallVector
            ((SmallVector<slang::parsing::Token,_16UL> *)0x635739);
  local_5f1 = 0;
  MacroParser::MacroParser
            ((MacroParser *)in_stack_fffffffffffff6c0,
             (Preprocessor *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
  local_638 = in_RSI->sourceManager;
  pDStack_630 = (pointer)((__extent_storage<18446744073709551615UL> *)&in_RSI->alloc)->
                         _M_extent_value;
  newBuffer._M_ptr = (pointer)in_RSI->sourceManager;
  newBuffer._M_extent._M_extent_value = (size_t)in_RSI->alloc;
  MacroParser::setBuffer(&local_618,newBuffer);
  Token::Token((Token *)in_stack_fffffffffffff6c0);
LAB_0063579b:
  do {
    TVar11 = MacroParser::next((MacroParser *)in_stack_fffffffffffff6c0);
    unique0x100020fe = TVar11;
    local_648 = TVar11;
    bVar2 = Token::operator_cast_to_bool((Token *)0x6357f7);
    if (!bVar2) {
      if ((local_5f1 & 1) != 0) {
        iVar4 = SmallVectorBase<slang::parsing::Token>::copy
                          (local_4d8,(EVP_PKEY_CTX *)in_RDI[1],src);
        std::span<const_slang::parsing::Token,_18446744073709551615UL>::
        span<slang::parsing::Token,_18446744073709551615UL>
                  ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                   in_stack_fffffffffffff6d0,
                   (span<slang::parsing::Token,_18446744073709551615UL> *)
                   CONCAT44(extraout_var,iVar4));
        in_RSI->sourceManager = local_750;
        ((__extent_storage<18446744073709551615UL> *)&in_RSI->alloc)->_M_extent_value = local_748;
      }
      local_3a1 = true;
LAB_00636b0c:
      local_6ac = 1;
      SmallVector<slang::parsing::Token,_16UL>::~SmallVector
                ((SmallVector<slang::parsing::Token,_16UL> *)0x636b19);
      SmallVector<slang::parsing::Token,_16UL>::~SmallVector
                ((SmallVector<slang::parsing::Token,_16UL> *)0x636b26);
      return local_3a1;
    }
    if (local_648.kind != Directive) {
LAB_00635840:
      SmallVectorBase<slang::parsing::Token>::push_back
                ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff6c0,
                 (Token *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      goto LAB_0063579b;
    }
    SVar3 = Token::directiveKind((Token *)in_stack_fffffffffffff6c0);
    if (SVar3 != MacroUsage) goto LAB_00635840;
    TVar11.info = in_stack_fffffffffffff740;
    TVar11._0_8_ = in_stack_fffffffffffff738;
    local_678 = local_648;
    MVar12 = findMacro(in_stack_fffffffffffff730,TVar11);
    local_688 = MVar12.syntax._0_6_;
    uStack_682 = MVar12.syntax._6_2_;
    _local_680 = MVar12._8_6_;
    uStack_67a = MVar12._14_2_;
    local_668._8_4_ = local_680;
    local_668[0xc] = bStack_67c;
    local_668[0xd] = bStack_67b;
    local_668._0_6_ = local_688;
    local_668._6_2_ = uStack_682;
    bVar2 = MacroDef::valid((MacroDef *)local_668);
    if (bVar2) {
      bVar2 = MacroDef::isIntrinsic((MacroDef *)local_668);
      if (!bVar2) {
        in_stack_fffffffffffff838 = (MacroParser *)&in_RDX[4]._M_extent;
        local_228 = (DefineDirectiveSyntax **)local_668;
        local_220 = (__extent_storage<18446744073709551615UL> *)in_stack_fffffffffffff838;
        local_1f0 = local_228;
        local_1e8 = (__extent_storage<18446744073709551615UL> *)in_stack_fffffffffffff838;
        local_1c8 = local_228;
        local_1c0 = (__extent_storage<18446744073709551615UL> *)in_stack_fffffffffffff838;
        local_1d0 = boost::unordered::detail::foa::
                    table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                    ::hash_for<slang::syntax::DefineDirectiveSyntax_const*>
                              ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                                *)in_stack_fffffffffffff6c0,
                               (DefineDirectiveSyntax **)
                               CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        in_stack_fffffffffffff840 = local_1c8;
        in_stack_fffffffffffff848 =
             (Info *)boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                     ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                                     *)in_stack_fffffffffffff6c0,
                                    CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        local_178 = local_1d0;
        local_170 = in_stack_fffffffffffff848;
        local_168 = in_stack_fffffffffffff840;
        local_160 = (__extent_storage<18446744073709551615UL> *)in_stack_fffffffffffff838;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_188,(size_t)in_stack_fffffffffffff848);
        do {
          local_190 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_188);
          local_198 = boost::unordered::detail::foa::
                      table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                      ::groups((table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                                *)0x635af1);
          local_198 = local_198 + local_190;
          local_19c = boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::match
                                ((group15<boost::unordered::detail::foa::plain_integral> *)
                                 in_stack_fffffffffffff6c8,(size_t)in_stack_fffffffffffff6c0);
          if (local_19c != 0) {
            local_1a8 = boost::unordered::detail::foa::
                        table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                        ::elements((table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                                    *)0x635b53);
            local_1b0 = local_1a8 + local_190 * 0xf;
            do {
              local_1b4 = boost::unordered::detail::foa::unchecked_countr_zero(0);
              peVar5 = boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                       ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                               *)0x635ba6);
              ppDVar1 = local_168;
              ppDVar6 = boost::unordered::detail::foa::
                        table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                        ::key_from<slang::syntax::DefineDirectiveSyntax_const*>
                                  ((DefineDirectiveSyntax **)0x635bd6);
              bVar2 = std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>::operator()
                                (peVar5,ppDVar1,ppDVar6);
              if (bVar2) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
                ::table_locator(&local_208,local_198,local_1b4,local_1b0 + local_1b4);
                goto LAB_00635cf2;
              }
              local_19c = local_19c - 1 & local_19c;
            } while (local_19c != 0);
          }
          bVar2 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffff6c0,
                             CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
          if (bVar2) {
            memset(&local_208,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
            ::table_locator(&local_208);
            goto LAB_00635cf2;
          }
          bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_188,
                             (in_stack_fffffffffffff838->buffer)._M_extent._M_extent_value);
        } while (bVar2);
        memset(&local_208,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
        ::table_locator(&local_208);
LAB_00635cf2:
        local_1e0 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                    ::make_iterator((locator *)0x635d01);
        local_218 = local_1e0.pc_;
        local_210 = local_1e0.p_;
        boost::unordered::detail::foa::
        table<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
        ::end((table<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
               *)0x635d9e);
        bVar2 = boost::unordered::detail::foa::operator!=
                          ((table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_fffffffffffff6c0,
                           (table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        if (bVar2) {
          local_68c = 0x150004;
          local_698 = Token::location(&local_648);
          addDiag(in_stack_fffffffffffff6c0,SUB84((ulong)in_stack_fffffffffffff6d0 >> 0x20,0),
                  in_stack_fffffffffffff6c8);
          local_6a8 = Token::valueText((Token *)in_stack_fffffffffffff6d0);
          arg._M_str._0_4_ = in_stack_fffffffffffff710;
          arg._M_len = (size_t)in_stack_fffffffffffff708;
          arg._M_str._4_4_ = in_stack_fffffffffffff714;
          Diagnostic::operator<<(in_stack_fffffffffffff700,arg);
          local_3a1 = false;
          goto LAB_00636b0c;
        }
      }
      local_6b8 = (MacroActualArgumentListSyntax *)0x0;
      bVar2 = MacroDef::needsArgs((MacroDef *)local_668);
      psVar16 = in_RDX;
      if (bVar2) {
        prevToken.info = in_stack_fffffffffffff848;
        prevToken._0_8_ = in_stack_fffffffffffff840;
        local_6c8 = local_648;
        local_6b8 = MacroParser::parseActualArgumentList(in_stack_fffffffffffff838,prevToken);
        psVar16 = in_RDX;
        if (local_6b8 == (MacroActualArgumentListSyntax *)0x0) {
          local_3a1 = false;
          goto LAB_00636b0c;
        }
      }
      SmallVectorBase<slang::parsing::Token>::clear
                ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff6c0);
      in_stack_fffffffffffff6b8 = 0;
      local_708 = local_648;
      MacroExpansion::MacroExpansion
                (&local_6f8,(SourceManager *)*in_RDI,(BumpAllocator *)in_RDI[1],local_5f0,local_648,
                 false);
      local_718 = CONCAT26(local_668._6_2_,local_668._0_6_);
      uStack_710 = CONCAT26(local_668._14_2_,local_668._8_6_);
      bVar2 = expandMacro(in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,
                          in_stack_fffffffffffffef8,
                          (MacroActualArgumentListSyntax *)in_stack_fffffffffffffef0);
      if (!bVar2) {
        local_3a1 = false;
        goto LAB_00636b0c;
      }
      local_298 = local_668;
      in_RDX = psVar16;
      local_290 = &psVar16[4]._M_extent;
      local_2a0 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                  ::key_from<slang::syntax::DefineDirectiveSyntax_const*>
                            ((DefineDirectiveSyntax **)0x6360b5);
      local_2a8 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                  ::hash_for<slang::syntax::DefineDirectiveSyntax_const*>
                            ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                              *)in_stack_fffffffffffff6c0,
                             (DefineDirectiveSyntax **)
                             CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      local_2b0 = boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                  ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                                  *)in_stack_fffffffffffff6c0,
                                 CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      local_238 = local_2a0;
      local_248 = local_2a8;
      local_240 = local_2b0;
      local_230 = &psVar16[4]._M_extent;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_258,local_2b0);
      do {
        local_260 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_258);
        local_268 = boost::unordered::detail::foa::
                    table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                    ::groups((table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                              *)0x6361b8);
        local_268 = local_268 + local_260;
        local_26c = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::match
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               in_stack_fffffffffffff6c8,(size_t)in_stack_fffffffffffff6c0);
        if (local_26c != 0) {
          local_278 = boost::unordered::detail::foa::
                      table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                      ::elements((table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                                  *)0x63621a);
          local_280 = local_278 + local_260 * 0xf;
          do {
            local_284 = boost::unordered::detail::foa::unchecked_countr_zero(0);
            peVar5 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                     ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                             *)0x63626d);
            ppDVar1 = local_238;
            ppDVar6 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                      ::key_from<slang::syntax::DefineDirectiveSyntax_const*>
                                ((DefineDirectiveSyntax **)0x63629d);
            bVar2 = std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>::operator()
                              (peVar5,ppDVar1,ppDVar6);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
              ::table_locator(&local_2c8,local_268,local_284,local_280 + local_284);
              goto LAB_006363b9;
            }
            local_26c = local_26c - 1 & local_26c;
          } while (local_26c != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffff6c0,
                           CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        if (bVar2) {
          memset(&local_2c8,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
          ::table_locator(&local_2c8);
          goto LAB_006363b9;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_258,psVar16[5]._M_extent._M_extent_value);
      } while (bVar2);
      memset(&local_2c8,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
      ::table_locator(&local_2c8);
LAB_006363b9:
      bVar2 = boost::unordered::detail::foa::table_locator::operator_cast_to_bool
                        ((table_locator *)&local_2c8);
      if (bVar2) {
        local_2d8 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                    ::make_iterator((locator *)0x6363db);
        local_2d9 = false;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_730,&local_2d8,&local_2d9);
      }
      else if ((pointer)psVar16[7]._M_extent._M_extent_value < psVar16[7]._M_ptr) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
        ::unchecked_emplace_at<slang::syntax::DefineDirectiveSyntax_const*const&>
                  (in_stack_fffffffffffff6e0,(size_t)in_stack_fffffffffffff6d8,
                   (size_t)in_stack_fffffffffffff6d0,
                   (DefineDirectiveSyntax **)in_stack_fffffffffffff6c8);
        local_2f0 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                    ::make_iterator((locator *)0x636463);
        local_309[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_730,&local_2f0,local_309);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
        ::unchecked_emplace_with_rehash<slang::syntax::DefineDirectiveSyntax_const*const&>
                  ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                    *)in_stack_fffffffffffff730,in_stack_fffffffffffff728,
                   (DefineDirectiveSyntax **)in_stack_fffffffffffff720);
        local_320 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                    ::make_iterator((locator *)0x6364ce);
        local_339[0] = true;
        std::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool>
        ::
        pair<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>,_bool,_true>
                  (&local_730,&local_320,local_339);
      }
      std::span<const_slang::parsing::Token,_18446744073709551615UL>::
      span<slang::SmallVector<slang::parsing::Token,_16UL>_&>
                ((span<const_slang::parsing::Token,_18446744073709551615UL> *)
                 in_stack_fffffffffffff6d0,
                 (SmallVector<slang::parsing::Token,_16UL> *)in_stack_fffffffffffff6c8);
      bVar2 = expandReplacementList(in_RSI,in_RDX,in_stack_fffffffffffffc38);
      if (!bVar2) {
        local_3a1 = false;
        goto LAB_00636b0c;
      }
      in_stack_fffffffffffff730 = (Preprocessor *)&in_RDX[4]._M_extent;
      in_stack_fffffffffffff720 = (Diagnostic *)local_668;
      p_Var15 = (__extent_storage<18446744073709551615UL> *)in_stack_fffffffffffff730;
      in_stack_fffffffffffffef0 = in_stack_fffffffffffff720;
      in_stack_fffffffffffffef8 = (MacroExpansion *)in_stack_fffffffffffff730;
      pIVar7 = (Info *)boost::unordered::detail::foa::
                       table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                       ::hash_for<slang::syntax::DefineDirectiveSyntax_const*>
                                 ((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                                   *)in_stack_fffffffffffff6c0,
                                  (DefineDirectiveSyntax **)
                                  CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      in_stack_fffffffffffff740 = pIVar7;
      in_stack_fffffffffffff728 =
           boost::unordered::detail::foa::
           table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
           ::position_for((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                           *)in_stack_fffffffffffff6c0,
                          CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      in_stack_fffffffffffff738 = p_Var15;
      local_68 = pIVar7;
      local_60 = in_stack_fffffffffffff728;
      local_58 = in_stack_fffffffffffff720;
      local_50 = p_Var15;
      boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                (&local_78,in_stack_fffffffffffff728);
      do {
        sVar8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_78);
        pgVar9 = boost::unordered::detail::foa::
                 table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                 ::groups((table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                           *)0x6366d9);
        local_8c = boost::unordered::detail::foa::
                   group15<boost::unordered::detail::foa::plain_integral>::match
                             ((group15<boost::unordered::detail::foa::plain_integral> *)
                              in_stack_fffffffffffff6c8,(size_t)in_stack_fffffffffffff6c0);
        in_stack_fffffffffffff714 = local_8c;
        if (local_8c != 0) {
          ppDVar10 = boost::unordered::detail::foa::
                     table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                     ::elements((table_arrays<const_slang::syntax::DefineDirectiveSyntax_*,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                                 *)0x636732);
          do {
            n_ = boost::unordered::detail::foa::unchecked_countr_zero(0);
            peVar5 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                     ::pred((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                             *)0x636782);
            in_stack_fffffffffffff700 = local_58;
            in_stack_fffffffffffff708 =
                 boost::unordered::detail::foa::
                 table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                 ::key_from<slang::syntax::DefineDirectiveSyntax_const*>
                           ((DefineDirectiveSyntax **)0x6367ac);
            bVar2 = std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>::operator()
                              (peVar5,(DefineDirectiveSyntax **)in_stack_fffffffffffff700,
                               in_stack_fffffffffffff708);
            if (bVar2) {
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
              ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
                               *)&stack0xffffffffffffff08,pgVar9 + sVar8,n_,
                              ppDVar10 + sVar8 * 0xf + (ulong)n_);
              goto LAB_006368b3;
            }
            local_8c = local_8c - 1 & local_8c;
          } while (local_8c != 0);
        }
        bVar2 = boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                          ((group15<boost::unordered::detail::foa::plain_integral> *)
                           in_stack_fffffffffffff6c0,
                           CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        if (bVar2) {
          memset(&stack0xffffffffffffff08,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
          ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
                           *)&stack0xffffffffffffff08);
          goto LAB_006368b3;
        }
        bVar2 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                          (&local_78,p_Var15[2]._M_extent_value);
      } while (bVar2);
      memset(&stack0xffffffffffffff08,0,0x18);
      boost::unordered::detail::foa::
      table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
      ::table_locator((table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_const_slang::syntax::DefineDirectiveSyntax_*>
                       *)&stack0xffffffffffffff08);
LAB_006368b3:
      iVar13 = boost::unordered::detail::foa::
               table<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
               ::make_iterator((locator *)0x6368c0);
      local_d0 = (pointer)iVar13.pc_;
      local_c8 = iVar13.p_;
      local_120 = local_d0;
      ppDStack_118 = local_c8;
      local_130 = boost::unordered::detail::foa::
                  table<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                  ::end((table<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                         *)0x6368fa);
      bVar2 = boost::unordered::detail::foa::operator!=
                        ((table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)in_stack_fffffffffffff6c0,
                         (table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
      if (bVar2) {
        local_148 = local_120;
        ppDStack_140 = ppDStack_118;
        local_30._16_8_ = &local_158;
        local_30._0_8_ = local_120;
        local_30._8_8_ = ppDStack_118;
        in_stack_fffffffffffff6d0 = (SmallVectorBase<slang::parsing::Token> *)local_30;
        pPVar14 = in_stack_fffffffffffff730;
        local_38 = in_stack_fffffffffffff730;
        in_stack_fffffffffffff6e0 =
             (table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
              *)boost::unordered::detail::foa::
                table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                ::pc((table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                      *)0x63699e);
        local_30._24_8_ =
             boost::unordered::detail::foa::
             table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
             ::p((table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                  *)0x6369ad);
        local_10 = in_stack_fffffffffffff6e0;
        local_8 = in_stack_fffffffffffff730;
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
        ::destroy_element((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                           *)in_stack_fffffffffffff6c0,
                          (element_type *)
                          CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
        ::recover_slot((table_core<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<const_slang::syntax::DefineDirectiveSyntax_*,_void>,_std::equal_to<const_slang::syntax::DefineDirectiveSyntax_*>,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                        *)in_stack_fffffffffffff6c0,
                       (uchar *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
        local_48 = (pointer)local_30._0_8_;
        ppDStack_40 = (table_element_pointer)local_30._8_8_;
        pos_.p_ = (table_element_pointer)local_30._8_8_;
        pos_.pc_ = (char_pointer)local_30._0_8_;
        boost::unordered::detail::foa::
        table_erase_return_type<boost::unordered::detail::foa::table_iterator<boost::unordered::detail::foa::flat_set_types<const_slang::syntax::DefineDirectiveSyntax_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>_>
        ::table_erase_return_type(&local_158,pos_);
        in_stack_fffffffffffff6d8 = in_stack_fffffffffffff730;
        in_stack_fffffffffffff730 = pPVar14;
      }
      in_stack_ffffffffffffff00 = (Preprocessor *)(ulong)bVar2;
      SmallVectorBase<slang::parsing::Token>::
      append_range<std::span<const_slang::parsing::Token,_18446744073709551615UL>_>
                (in_stack_fffffffffffff6d0,
                 (span<const_slang::parsing::Token,_18446744073709551615UL> *)
                 in_stack_fffffffffffff6c8);
      local_5f1 = 1;
    }
    else {
      SmallVectorBase<slang::parsing::Token>::push_back
                ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffff6c0,
                 (Token *)CONCAT44(in_stack_fffffffffffff6bc,in_stack_fffffffffffff6b8));
    }
  } while( true );
}

Assistant:

bool Preprocessor::expandReplacementList(
    std::span<Token const>& tokens, SmallSet<const DefineDirectiveSyntax*, 8>& alreadyExpanded) {

    SmallVector<Token, 16> outBuffer;
    SmallVector<Token, 16> expansionBuffer;

    bool expandedSomething = false;
    MacroParser parser(*this);
    parser.setBuffer(tokens);

    // loop through each token in the replacement list and expand it if it's a nested macro
    Token token;
    while ((token = parser.next())) {
        if (token.kind != TokenKind::Directive || token.directiveKind() != SyntaxKind::MacroUsage) {
            outBuffer.push_back(token);
            continue;
        }

        // lookup the macro definition
        auto macro = findMacro(token);
        if (!macro.valid()) {
            // If we couldn't find the macro, just keep trucking.
            // It's possible that a future expansion will make this valid.
            outBuffer.push_back(token);
            continue;
        }

        if (!macro.isIntrinsic() && alreadyExpanded.count(macro.syntax)) {
            addDiag(diag::RecursiveMacro, token.location()) << token.valueText();
            return false;
        }

        // parse arguments if necessary
        MacroActualArgumentListSyntax* actualArgs = nullptr;
        if (macro.needsArgs()) {
            actualArgs = parser.parseActualArgumentList(token);
            if (!actualArgs)
                return false;
        }

        expansionBuffer.clear();
        MacroExpansion expansion{sourceManager, alloc, expansionBuffer, token, false};
        if (!expandMacro(macro, expansion, actualArgs))
            return false;

        // Recursively expand out nested macros; this ensures that we detect
        // any potentially recursive macros.
        alreadyExpanded.insert(macro.syntax);
        std::span<const Token> expanded = expansionBuffer;
        if (!expandReplacementList(expanded, alreadyExpanded))
            return false;

        alreadyExpanded.erase(macro.syntax);
        outBuffer.append_range(expanded);
        expandedSomething = true;
    }

    // Make a heap copy of the tokens before we leave, if we actually expanded something.
    if (expandedSomething)
        tokens = outBuffer.copy(alloc);
    return true;
}